

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::reactor_op>::~op_queue
          (op_queue<boost::asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  code *pcVar2;
  reactor_op *tmp;
  reactor_op *prVar3;
  undefined4 local_30 [2];
  error_category *local_28;
  
  prVar3 = this->front_;
  if (prVar3 != (reactor_op *)0x0) {
    do {
      prVar1 = *(reactor_op **)prVar3;
      this->front_ = prVar1;
      if (prVar1 == (reactor_op *)0x0) {
        this->back_ = (reactor_op *)0x0;
      }
      *(long *)prVar3 = 0;
      pcVar2 = *(code **)(prVar3 + 8);
      local_30[0] = 0;
      local_28 = system::system_category();
      (*pcVar2)(0,prVar3,local_30,0);
      prVar3 = this->front_;
    } while (prVar3 != (reactor_op *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }